

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_ref_frames(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int segment_id,
                    MV_REFERENCE_FRAME *ref_frame)

{
  REFERENCE_MODE RVar1;
  COMP_REFERENCE_TYPE CVar2;
  MV_REFERENCE_FRAME MVar3;
  int iVar4;
  int in_ECX;
  MACROBLOCKD *in_RDX;
  uint8_t segment_id_00;
  long in_RSI;
  AV1_COMMON *in_RDI;
  MV_REFERENCE_FRAME *in_R8;
  int bit3;
  int bit4;
  int bit2_2;
  int bit5;
  int bit1_2;
  int bit0;
  int bit1_bwd;
  int bit_bwd;
  int bit2_1;
  int bit1_1;
  int bit;
  int idx;
  int bit2;
  int bit1;
  int bit_1;
  COMP_REFERENCE_TYPE comp_ref_type;
  REFERENCE_MODE mode;
  aom_reader *in_stack_ffffffffffffff28;
  MACROBLOCKD *in_stack_ffffffffffffff30;
  AV1_COMMON *in_stack_ffffffffffffff38;
  
  if ((*(ushort *)(**(long **)(in_RSI + 0x1eb8) + 0xa7) >> 6 & 1) == 0) {
    segment_id_00 = (uint8_t)in_ECX;
    iVar4 = segfeature_active(&in_RDI->seg,segment_id_00,'\x05');
    if (iVar4 == 0) {
      iVar4 = segfeature_active(&in_RDI->seg,segment_id_00,'\x06');
      if ((iVar4 == 0) && (iVar4 = segfeature_active(&in_RDI->seg,segment_id_00,'\a'), iVar4 == 0))
      {
        RVar1 = read_block_reference_mode
                          (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28);
        if (RVar1 == '\x01') {
          CVar2 = read_comp_reference_type(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if (CVar2 == '\0') {
            av1_get_pred_cdf_uni_comp_ref_p(in_stack_ffffffffffffff30);
            iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                     (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
            if (iVar4 == 0) {
              av1_get_pred_cdf_uni_comp_ref_p1(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              if (iVar4 == 0) {
                *in_R8 = '\x01';
                in_R8[1] = '\x02';
              }
              else {
                av1_get_pred_cdf_uni_comp_ref_p2(in_stack_ffffffffffffff30);
                iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                         (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
                if (iVar4 == 0) {
                  *in_R8 = '\x01';
                  in_R8[1] = '\x03';
                }
                else {
                  *in_R8 = '\x01';
                  in_R8[1] = '\x04';
                }
              }
            }
            else {
              *in_R8 = '\x05';
              in_R8[1] = '\a';
            }
          }
          else {
            av1_get_pred_cdf_comp_ref_p(in_stack_ffffffffffffff30);
            iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                     (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
            if (iVar4 == 0) {
              av1_get_pred_cdf_comp_ref_p1(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              MVar3 = '\x01';
              if (iVar4 != 0) {
                MVar3 = '\x02';
              }
              *in_R8 = MVar3;
            }
            else {
              av1_get_pred_cdf_comp_ref_p2(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              MVar3 = '\x03';
              if (iVar4 != 0) {
                MVar3 = '\x04';
              }
              *in_R8 = MVar3;
            }
            av1_get_pred_cdf_comp_bwdref_p(in_stack_ffffffffffffff30);
            iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                     (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
            if (iVar4 == 0) {
              av1_get_pred_cdf_comp_bwdref_p1(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              MVar3 = '\x05';
              if (iVar4 != 0) {
                MVar3 = '\x06';
              }
              in_R8[1] = MVar3;
            }
            else {
              in_R8[1] = '\a';
            }
          }
        }
        else if (RVar1 == '\0') {
          av1_get_pred_cdf_single_ref_p1(in_stack_ffffffffffffff30);
          iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                   (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
          if (iVar4 == 0) {
            av1_get_pred_cdf_single_ref_p3(in_stack_ffffffffffffff30);
            iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                     (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
            if (iVar4 == 0) {
              av1_get_pred_cdf_single_ref_p4(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_RDX,0);
              MVar3 = '\x01';
              if (iVar4 != 0) {
                MVar3 = '\x02';
              }
              *in_R8 = MVar3;
            }
            else {
              av1_get_pred_cdf_single_ref_p5(in_RDX);
              iVar4 = aom_read_symbol_((aom_reader *)in_RDX,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              MVar3 = '\x03';
              if (iVar4 != 0) {
                MVar3 = '\x04';
              }
              *in_R8 = MVar3;
            }
          }
          else {
            av1_get_pred_cdf_single_ref_p2(in_stack_ffffffffffffff30);
            iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                     (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
            if (iVar4 == 0) {
              av1_get_pred_cdf_single_ref_p6(in_stack_ffffffffffffff30);
              iVar4 = aom_read_symbol_((aom_reader *)in_stack_ffffffffffffff30,
                                       (aom_cdf_prob *)in_stack_ffffffffffffff28,0);
              MVar3 = '\x05';
              if (iVar4 != 0) {
                MVar3 = '\x06';
              }
              *in_R8 = MVar3;
            }
            else {
              *in_R8 = '\a';
            }
          }
          in_R8[1] = -1;
        }
      }
      else {
        *in_R8 = '\x01';
        in_R8[1] = -1;
      }
    }
    else {
      iVar4 = get_segdata(&in_RDI->seg,in_ECX,'\x05');
      *in_R8 = (MV_REFERENCE_FRAME)iVar4;
      in_R8[1] = -1;
    }
  }
  else {
    set_ref_frames_for_skip_mode(in_RDI,in_R8);
  }
  return;
}

Assistant:

static void read_ref_frames(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                            aom_reader *r, int segment_id,
                            MV_REFERENCE_FRAME ref_frame[2]) {
  if (xd->mi[0]->skip_mode) {
    set_ref_frames_for_skip_mode(cm, ref_frame);
    return;
  }

  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME)) {
    ref_frame[0] = (MV_REFERENCE_FRAME)get_segdata(&cm->seg, segment_id,
                                                   SEG_LVL_REF_FRAME);
    ref_frame[1] = NONE_FRAME;
  } else if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP) ||
             segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
    ref_frame[0] = LAST_FRAME;
    ref_frame[1] = NONE_FRAME;
  } else {
    const REFERENCE_MODE mode = read_block_reference_mode(cm, xd, r);

    if (mode == COMPOUND_REFERENCE) {
      const COMP_REFERENCE_TYPE comp_ref_type = read_comp_reference_type(xd, r);

      if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
        const int bit = READ_REF_BIT(uni_comp_ref_p);
        if (bit) {
          ref_frame[0] = BWDREF_FRAME;
          ref_frame[1] = ALTREF_FRAME;
        } else {
          const int bit1 = READ_REF_BIT(uni_comp_ref_p1);
          if (bit1) {
            const int bit2 = READ_REF_BIT(uni_comp_ref_p2);
            if (bit2) {
              ref_frame[0] = LAST_FRAME;
              ref_frame[1] = GOLDEN_FRAME;
            } else {
              ref_frame[0] = LAST_FRAME;
              ref_frame[1] = LAST3_FRAME;
            }
          } else {
            ref_frame[0] = LAST_FRAME;
            ref_frame[1] = LAST2_FRAME;
          }
        }

        return;
      }

      assert(comp_ref_type == BIDIR_COMP_REFERENCE);

      const int idx = 1;
      const int bit = READ_REF_BIT(comp_ref_p);
      // Decode forward references.
      if (!bit) {
        const int bit1 = READ_REF_BIT(comp_ref_p1);
        ref_frame[!idx] = bit1 ? LAST2_FRAME : LAST_FRAME;
      } else {
        const int bit2 = READ_REF_BIT(comp_ref_p2);
        ref_frame[!idx] = bit2 ? GOLDEN_FRAME : LAST3_FRAME;
      }

      // Decode backward references.
      const int bit_bwd = READ_REF_BIT(comp_bwdref_p);
      if (!bit_bwd) {
        const int bit1_bwd = READ_REF_BIT(comp_bwdref_p1);
        ref_frame[idx] = bit1_bwd ? ALTREF2_FRAME : BWDREF_FRAME;
      } else {
        ref_frame[idx] = ALTREF_FRAME;
      }
    } else if (mode == SINGLE_REFERENCE) {
      const int bit0 = READ_REF_BIT(single_ref_p1);
      if (bit0) {
        const int bit1 = READ_REF_BIT(single_ref_p2);
        if (!bit1) {
          const int bit5 = READ_REF_BIT(single_ref_p6);
          ref_frame[0] = bit5 ? ALTREF2_FRAME : BWDREF_FRAME;
        } else {
          ref_frame[0] = ALTREF_FRAME;
        }
      } else {
        const int bit2 = READ_REF_BIT(single_ref_p3);
        if (bit2) {
          const int bit4 = READ_REF_BIT(single_ref_p5);
          ref_frame[0] = bit4 ? GOLDEN_FRAME : LAST3_FRAME;
        } else {
          const int bit3 = READ_REF_BIT(single_ref_p4);
          ref_frame[0] = bit3 ? LAST2_FRAME : LAST_FRAME;
        }
      }

      ref_frame[1] = NONE_FRAME;
    } else {
      assert(0 && "Invalid prediction mode.");
    }
  }
}